

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<std::istream>
               (ImputeNode *node,basic_istream<char,_std::char_traits<char>_> *in)

{
  bool bVar1;
  long in_RDI;
  vector<double,_std::allocator<double>_> *v;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t data_sizets [5];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff98;
  istream *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  long local_20;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>
              (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,(istream *)0x67a153);
    *(undefined8 *)(in_RDI + 0x60) = local_38;
    read_bytes<double>(in_stack_ffffffffffffffb0._M_current,
                       (size_t)in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0);
    read_bytes<double>(in_stack_ffffffffffffffb0._M_current,
                       (size_t)in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (local_20 != 0) {
      in_stack_ffffffffffffffb0 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(in_stack_ffffffffffffff98);
      in_stack_ffffffffffffffa8 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::end(in_stack_ffffffffffffff98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_ffffffffffffff98), bVar1) {
        in_stack_ffffffffffffffa0 =
             (istream *)
             __gnu_cxx::
             __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator*((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)&stack0xffffffffffffffb0);
        read_bytes<unsigned_long>
                  (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,(istream *)0x67a210);
        read_bytes<double>(in_stack_ffffffffffffffb0._M_current,
                           (size_t)in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0);
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                      *)&stack0xffffffffffffffb0);
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::shrink_to_fit((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)0x67a240);
    read_bytes<double>(in_stack_ffffffffffffffb0._M_current,
                       (size_t)in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void deserialize_node(ImputeNode &node, itype &in)
{
    if (interrupt_switch) return;

    size_t data_sizets[5];
    read_bytes<size_t>((void*)data_sizets, (size_t)5, in);
    node.parent = data_sizets[0];

    read_bytes<double>(node.num_sum, data_sizets[1], in);

    read_bytes<double>(node.num_weight, data_sizets[2], in);

    node.cat_sum.resize(data_sizets[3]);
    if (data_sizets[3]) {
        size_t veclen;
        for (auto &v : node.cat_sum) {
            read_bytes<size_t>((void*)&veclen, (size_t)1, in);
            read_bytes<double>(v, veclen, in);
        }
    }
    node.cat_sum.shrink_to_fit();

    read_bytes<double>(node.cat_weight, data_sizets[4], in);
}